

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetworkLayerValidator.cpp
# Opt level: O1

Result * __thiscall
CoreML::NeuralNetworkSpecValidator::validateArgsortLayer
          (Result *__return_storage_ptr__,NeuralNetworkSpecValidator *this,NeuralNetworkLayer *layer
          )

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  ActivationLinear *pAVar3;
  bool bVar4;
  LayerUnion LVar5;
  LogMessage *other;
  long *plVar6;
  undefined8 *puVar7;
  uint uVar8;
  size_type *psVar9;
  ActivationLinear *pAVar10;
  long *plVar11;
  ulong *puVar12;
  ulong uVar13;
  Result *_result;
  undefined8 uVar14;
  _Alloc_hider _Var15;
  uint uVar16;
  uint uVar17;
  uint uVar18;
  ActivationLinear *__val;
  string err_1;
  string __str;
  string err;
  ulong *local_190;
  long local_188;
  ulong local_180;
  long lStack_178;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_170;
  long *local_150;
  undefined8 local_148;
  long local_140;
  undefined8 uStack_138;
  ulong *local_130;
  long local_128;
  ulong local_120 [2];
  long *local_110;
  long local_108;
  long local_100;
  long lStack_f8;
  long local_f0;
  long *local_e8 [2];
  long local_d8 [2];
  long *local_c8;
  long local_c0;
  long local_b8;
  long lStack_b0;
  long *local_a8;
  long local_a0;
  long local_98;
  long lStack_90;
  undefined1 local_88 [56];
  string local_50;
  
  validateInputCount(__return_storage_ptr__,layer,1,1);
  bVar4 = Result::good(__return_storage_ptr__);
  if (!bVar4) {
    return __return_storage_ptr__;
  }
  pcVar2 = (__return_storage_ptr__->m_message)._M_dataplus._M_p;
  paVar1 = &(__return_storage_ptr__->m_message).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  if (!bVar4) {
    return __return_storage_ptr__;
  }
  validateOutputCount(__return_storage_ptr__,layer,1,1);
  bVar4 = Result::good(__return_storage_ptr__);
  if (!bVar4) {
    return __return_storage_ptr__;
  }
  pcVar2 = (__return_storage_ptr__->m_message)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  if (!bVar4) {
    return __return_storage_ptr__;
  }
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"Argsort","");
  validateInputOutputRankEquality(__return_storage_ptr__,layer,&local_50,&this->blobNameToRank);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  bVar4 = Result::good(__return_storage_ptr__);
  if (!bVar4) {
    return __return_storage_ptr__;
  }
  pcVar2 = (__return_storage_ptr__->m_message)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  if (!bVar4) {
    return __return_storage_ptr__;
  }
  if (layer->_oneof_case_[0] == 0x5b5) {
    LVar5 = layer->layer_;
  }
  else {
    LVar5.argsort_ = Specification::ArgSortLayerParams::default_instance();
  }
  if ((long)((LVar5.activation_)->NonlinearityType_).linear_ < 0) {
    std::operator+(&local_170,
                   "Value of \'axis\' is negative for layer of type \'ArgSort\' and name \'",
                   (layer->name_).ptr_);
    plVar6 = (long *)std::__cxx11::string::append((char *)&local_170);
    psVar9 = (size_type *)(plVar6 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar6 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar9) {
      local_88._16_8_ = *psVar9;
      local_88._24_8_ = plVar6[3];
      local_88._0_8_ =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)(local_88 + 0x10);
    }
    else {
      local_88._16_8_ = *psVar9;
      local_88._0_8_ =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)*plVar6;
    }
    local_88._8_8_ = plVar6[1];
    *plVar6 = (long)psVar9;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_170._M_dataplus._M_p != &local_170.field_2) {
      operator_delete(local_170._M_dataplus._M_p,local_170.field_2._M_allocated_capacity + 1);
    }
    Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,(string *)local_88);
    uVar14 = local_88._16_8_;
    _Var15._M_p = (pointer)local_88._0_8_;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._0_8_ ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)(local_88 + 0x10)) {
      return __return_storage_ptr__;
    }
LAB_00323a69:
    operator_delete(_Var15._M_p,uVar14 + 1);
  }
  else {
    if (0 < (layer->inputtensor_).super_RepeatedPtrFieldBase.current_size_) {
      if ((layer->inputtensor_).super_RepeatedPtrFieldBase.current_size_ < 1) {
        google::protobuf::internal::LogMessage::LogMessage
                  ((LogMessage *)local_88,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/repeated_field.h"
                   ,0x5c6);
        other = google::protobuf::internal::LogMessage::operator<<
                          ((LogMessage *)local_88,"CHECK failed: (index) < (current_size_): ");
        google::protobuf::internal::LogFinisher::operator=((LogFinisher *)&local_170,other);
        google::protobuf::internal::LogMessage::~LogMessage((LogMessage *)local_88);
      }
      local_f0 = (long)*(int *)((long)((layer->inputtensor_).super_RepeatedPtrFieldBase.rep_)->
                                      elements[0] + 0x24);
      if (((long)((LVar5.activation_)->NonlinearityType_).linear_ < 0) ||
         (local_f0 <= (long)((LVar5.activation_)->NonlinearityType_).linear_)) {
        pAVar3 = ((LVar5.activation_)->NonlinearityType_).linear_;
        __val = (ActivationLinear *)-(long)pAVar3;
        if (0 < (long)pAVar3) {
          __val = pAVar3;
        }
        uVar17 = 1;
        if ((ActivationLinear *)0x9 < __val) {
          pAVar10 = __val;
          uVar16 = 4;
          do {
            uVar17 = uVar16;
            if (pAVar10 < (ActivationLinear *)0x64) {
              uVar17 = uVar17 - 2;
              goto LAB_0032361c;
            }
            if (pAVar10 < (ActivationLinear *)0x3e8) {
              uVar17 = uVar17 - 1;
              goto LAB_0032361c;
            }
            if (pAVar10 < (ActivationLinear *)0x2710) goto LAB_0032361c;
            bVar4 = (ActivationLinear *)0x1869f < pAVar10;
            pAVar10 = (ActivationLinear *)((ulong)pAVar10 / 10000);
            uVar16 = uVar17 + 4;
          } while (bVar4);
          uVar17 = uVar17 + 1;
        }
LAB_0032361c:
        local_e8[0] = local_d8;
        std::__cxx11::string::_M_construct
                  ((ulong)local_e8,(char)uVar17 - (char)((long)pAVar3 >> 0x3f));
        std::__detail::__to_chars_10_impl<unsigned_long>
                  ((char *)((long)local_e8[0] - ((long)pAVar3 >> 0x3f)),uVar17,(unsigned_long)__val)
        ;
        plVar6 = (long *)std::__cxx11::string::replace((ulong)local_e8,0,(char *)0x0,0x369f8f);
        local_110 = &local_100;
        plVar11 = plVar6 + 2;
        if ((long *)*plVar6 == plVar11) {
          local_100 = *plVar11;
          lStack_f8 = plVar6[3];
        }
        else {
          local_100 = *plVar11;
          local_110 = (long *)*plVar6;
        }
        local_108 = plVar6[1];
        *plVar6 = (long)plVar11;
        plVar6[1] = 0;
        *(undefined1 *)(plVar6 + 2) = 0;
        plVar6 = (long *)std::__cxx11::string::append((char *)&local_110);
        local_190 = &local_180;
        puVar12 = (ulong *)(plVar6 + 2);
        if ((ulong *)*plVar6 == puVar12) {
          local_180 = *puVar12;
          lStack_178 = plVar6[3];
        }
        else {
          local_180 = *puVar12;
          local_190 = (ulong *)*plVar6;
        }
        local_188 = plVar6[1];
        *plVar6 = (long)puVar12;
        plVar6[1] = 0;
        *(undefined1 *)(plVar6 + 2) = 0;
        uVar17 = -(uint)local_f0;
        if (0 < (int)(uint)local_f0) {
          uVar17 = (uint)local_f0;
        }
        uVar16 = 1;
        if (9 < uVar17) {
          uVar13 = (ulong)uVar17;
          uVar18 = 4;
          do {
            uVar16 = uVar18;
            uVar8 = (uint)uVar13;
            if (uVar8 < 100) {
              uVar16 = uVar16 - 2;
              goto LAB_0032377b;
            }
            if (uVar8 < 1000) {
              uVar16 = uVar16 - 1;
              goto LAB_0032377b;
            }
            if (uVar8 < 10000) goto LAB_0032377b;
            uVar13 = uVar13 / 10000;
            uVar18 = uVar16 + 4;
          } while (99999 < uVar8);
          uVar16 = uVar16 + 1;
        }
LAB_0032377b:
        uVar18 = (uint)local_f0 >> 0x1f;
        local_130 = local_120;
        std::__cxx11::string::_M_construct
                  ((ulong)&local_130,(char)uVar16 - ((char)((ulong)local_f0 >> 0x18) >> 7));
        std::__detail::__to_chars_10_impl<unsigned_int>
                  ((char *)((ulong)uVar18 + (long)local_130),uVar16,uVar17);
        uVar13 = 0xf;
        if (local_190 != &local_180) {
          uVar13 = local_180;
        }
        if (uVar13 < (ulong)(local_128 + local_188)) {
          uVar13 = 0xf;
          if (local_130 != local_120) {
            uVar13 = local_120[0];
          }
          if (uVar13 < (ulong)(local_128 + local_188)) goto LAB_003237ef;
          puVar7 = (undefined8 *)
                   std::__cxx11::string::replace((ulong)&local_130,0,(char *)0x0,(ulong)local_190);
        }
        else {
LAB_003237ef:
          puVar7 = (undefined8 *)
                   std::__cxx11::string::_M_append((char *)&local_190,(ulong)local_130);
        }
        local_150 = &local_140;
        plVar6 = puVar7 + 2;
        if ((long *)*puVar7 == plVar6) {
          local_140 = *plVar6;
          uStack_138 = puVar7[3];
        }
        else {
          local_140 = *plVar6;
          local_150 = (long *)*puVar7;
        }
        local_148 = puVar7[1];
        *puVar7 = plVar6;
        puVar7[1] = 0;
        *(undefined1 *)plVar6 = 0;
        plVar6 = (long *)std::__cxx11::string::append((char *)&local_150);
        plVar11 = plVar6 + 2;
        if ((long *)*plVar6 == plVar11) {
          local_b8 = *plVar11;
          lStack_b0 = plVar6[3];
          local_c8 = &local_b8;
        }
        else {
          local_b8 = *plVar11;
          local_c8 = (long *)*plVar6;
        }
        local_c0 = plVar6[1];
        *plVar6 = (long)plVar11;
        plVar6[1] = 0;
        *(undefined1 *)(plVar6 + 2) = 0;
        plVar6 = (long *)std::__cxx11::string::_M_append
                                   ((char *)&local_c8,
                                    (ulong)(((layer->name_).ptr_)->_M_dataplus)._M_p);
        plVar11 = plVar6 + 2;
        if ((long *)*plVar6 == plVar11) {
          local_98 = *plVar11;
          lStack_90 = plVar6[3];
          local_a8 = &local_98;
        }
        else {
          local_98 = *plVar11;
          local_a8 = (long *)*plVar6;
        }
        local_a0 = plVar6[1];
        *plVar6 = (long)plVar11;
        plVar6[1] = 0;
        *(undefined1 *)(plVar6 + 2) = 0;
        plVar6 = (long *)std::__cxx11::string::append((char *)&local_a8);
        psVar9 = (size_type *)(plVar6 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar6 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar9) {
          local_170.field_2._M_allocated_capacity = *psVar9;
          local_170.field_2._8_8_ = plVar6[3];
          local_170._M_dataplus._M_p = (pointer)&local_170.field_2;
        }
        else {
          local_170.field_2._M_allocated_capacity = *psVar9;
          local_170._M_dataplus._M_p = (pointer)*plVar6;
        }
        local_170._M_string_length = plVar6[1];
        *plVar6 = (long)psVar9;
        plVar6[1] = 0;
        *(undefined1 *)(plVar6 + 2) = 0;
        if (local_a8 != &local_98) {
          operator_delete(local_a8,local_98 + 1);
        }
        if (local_c8 != &local_b8) {
          operator_delete(local_c8,local_b8 + 1);
        }
        if (local_150 != &local_140) {
          operator_delete(local_150,local_140 + 1);
        }
        if (local_130 != local_120) {
          operator_delete(local_130,local_120[0] + 1);
        }
        if (local_190 != &local_180) {
          operator_delete(local_190,local_180 + 1);
        }
        if (local_110 != &local_100) {
          operator_delete(local_110,local_100 + 1);
        }
        if (local_e8[0] != local_d8) {
          operator_delete(local_e8[0],local_d8[0] + 1);
        }
        Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&local_170);
        uVar14 = local_170.field_2._M_allocated_capacity;
        _Var15._M_p = local_170._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_170._M_dataplus._M_p == &local_170.field_2) {
          return __return_storage_ptr__;
        }
        goto LAB_00323a69;
      }
    }
    Result::Result(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

Result NeuralNetworkSpecValidator::validateArgsortLayer(const Specification::NeuralNetworkLayer& layer) {
    HANDLE_RESULT_AND_RETURN_ON_ERROR(validateInputCount(layer, 1, 1));
    HANDLE_RESULT_AND_RETURN_ON_ERROR(validateOutputCount(layer, 1, 1));
    HANDLE_RESULT_AND_RETURN_ON_ERROR(validateInputOutputRankEquality(layer, "Argsort", blobNameToRank));

    const auto& params = layer.argsort();

    if (params.axis() < 0) {
        const std::string err = "Value of 'axis' is negative for layer of type 'ArgSort' and name '" + layer.name() + "', which is not supported. It must be positive.";
        return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
    }

    if (layer.inputtensor_size() > 0) {
        const int rank = static_cast<int>(layer.inputtensor(0).rank());
        if (params.axis() < 0 || params.axis() >= rank) {
            const std::string err = "Value of 'axis' is " + std::to_string(params.axis()) + \
                                    ", but it must be in the range [0," \
                                    + std::to_string(rank) + ") for layer of type 'ArgSort' and name '" + layer.name() + "'.";
            return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
        }
    }
    return Result();
}